

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall nigel::Builder::Builder(Builder *this)

{
  Builder *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::BuilderTask>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::BuilderTask>_>_>_>
  ::map(&this->builderTasks);
  loadBuilderTasks(this);
  return;
}

Assistant:

Builder::Builder()
	{
		loadBuilderTasks();
	}